

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O3

int * __thiscall
google::protobuf::internal::ExtensionSet::GetRefEnum
          (ExtensionSet *this,int number,int *default_value)

{
  bool bVar1;
  AllocatedData AVar2;
  Extension *pEVar3;
  uint *puVar4;
  byte bVar5;
  uint in_ECX;
  uint uVar6;
  uint extraout_EDX;
  int index;
  int key;
  int key_00;
  ExtensionSet *this_00;
  ExtensionSet *this_01;
  FieldDescriptor *in_R8;
  pair<google::protobuf::internal::ExtensionSet::Extension_*,_bool> pVar7;
  LogMessageFatal aLStack_58 [16];
  ulong uStack_48;
  ExtensionSet EStack_40;
  undefined1 auStack_18 [16];
  
  this_00 = (ExtensionSet *)auStack_18;
  key = (int)auStack_18;
  AVar2.flat = (KeyValue *)FindOrNull(this,number);
  if ((AVar2.flat == (KeyValue *)0x0) ||
     ((((AVar2.flat)->second).field_0.uint64_t_value & 0x20000) != 0)) {
    return default_value;
  }
  if (*(bool *)((long)&((AVar2.flat)->second).field_0 + 1) == false) {
    bVar1 = ((AVar2.flat)->second).field_0.bool_value;
    uVar6 = (uint)bVar1;
    in_ECX = (uint)bVar1;
    if ((byte)(bVar1 - 0x13U) < 0xee) goto LAB_00259ca9;
    this_00 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4);
    default_value = (int *)AVar2.flat;
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)bVar1 * 4) == 8) {
      return &((KeyValue *)AVar2)->first;
    }
  }
  else {
    GetRefEnum();
LAB_00259ca9:
    uVar6 = in_ECX;
    GetRefEnum();
  }
  GetRefEnum();
  this_01 = &EStack_40;
  key_00 = (int)&EStack_40;
  uStack_48 = 0x259cd0;
  EStack_40.map_ = (AllocatedData)default_value;
  pVar7 = Insert(this_00,key);
  pEVar3 = pVar7.first;
  pEVar3->descriptor = in_R8;
  if (((undefined1  [16])pVar7 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
    if (pEVar3->is_repeated != false) goto LAB_00259d43;
    if ((byte)(pEVar3->type - 0x13) < 0xee) goto LAB_00259d53;
    this_01 = (ExtensionSet *)
              (ulong)*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4);
    if (*(uint *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4) == 8) {
      bVar5 = pEVar3->field_0xa;
      goto LAB_00259d29;
    }
  }
  else {
    pEVar3->type = (FieldType)extraout_EDX;
    if ((byte)((FieldType)extraout_EDX - 0x13) < 0xee) {
      uStack_48 = 0x259d43;
      SetEnum(&EStack_40);
LAB_00259d43:
      uStack_48 = 0x259d4b;
      SetEnum(&EStack_40);
    }
    else if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)(extraout_EDX & 0xff) * 4) ==
             8) {
      pEVar3->is_repeated = false;
      bVar5 = pEVar3->field_0xa & 0xfe;
LAB_00259d29:
      pEVar3->field_0xa = bVar5 & 0xfd;
      (pEVar3->field_0).uint32_t_value = uVar6;
      return (int *)pEVar3;
    }
    uStack_48 = 0x259d53;
    SetEnum();
LAB_00259d53:
    uStack_48 = 0x259d5b;
    SetEnum(&EStack_40);
  }
  uStack_48 = 0x259d63;
  SetEnum();
  uStack_48 = (ulong)uVar6;
  pEVar3 = FindOrNull(this_01,key_00);
  if (pEVar3 == (Extension *)0x0) {
    absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
              (aLStack_58,
               "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/extension_set.cc"
               ,0x1f8,0x14,"extension != nullptr");
    absl::lts_20240722::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20240722::log_internal::LogMessage::StringType)0>
              (aLStack_58,0x25,"Index out-of-bounds (field is empty).");
    goto LAB_00259df9;
  }
  if (pEVar3->is_repeated == false) {
    GetRepeatedEnum();
LAB_00259de9:
    GetRepeatedEnum();
  }
  else {
    if ((byte)(pEVar3->type - 0x13) < 0xee) goto LAB_00259de9;
    if (*(int *)(WireFormatLite::kFieldTypeToCppTypeMap + (ulong)pEVar3->type * 4) == 8) {
      puVar4 = (uint *)RepeatedField<int>::Get((RepeatedField<int> *)pEVar3->field_0,index);
      return (int *)(ulong)*puVar4;
    }
  }
  GetRepeatedEnum();
LAB_00259df9:
  absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(aLStack_58);
}

Assistant:

const int& ExtensionSet::GetRefEnum(int number,
                                    const int& default_value) const {
  const Extension* extension = FindOrNull(number);
  if (extension == nullptr || extension->is_cleared) {
    // Not present.  Return the default value.
    return default_value;
  } else {
    ABSL_DCHECK_TYPE(*extension, OPTIONAL_FIELD, ENUM);
    return extension->enum_value;
  }
}